

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrix.h
# Opt level: O1

Matrix44<float> * __thiscall
Imath_2_5::Matrix44<float>::inverse
          (Matrix44<float> *__return_storage_ptr__,Matrix44<float> *this,bool singExc)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  undefined8 uVar6;
  undefined8 *puVar7;
  SingMatrixExc *this_00;
  int i;
  undefined8 *puVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  bool bVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  undefined8 local_48;
  float local_40;
  undefined4 uStack_3c;
  float local_38;
  float fStack_34;
  float fStack_30;
  float local_2c;
  float local_28;
  float fStack_24;
  float local_20;
  float local_1c;
  undefined4 uStack_18;
  undefined4 uStack_14;
  undefined4 uStack_10;
  float local_c;
  
  puVar8 = &local_48;
  puVar7 = &local_48;
  fVar1 = this->x[0][3];
  if (((((fVar1 != 0.0) || (NAN(fVar1))) || (fVar1 = this->x[1][3], fVar1 != 0.0)) ||
      ((NAN(fVar1) || (fVar1 = this->x[2][3], fVar1 != 0.0)))) ||
     ((NAN(fVar1) || ((fVar1 = this->x[3][3], fVar1 != 1.0 || (NAN(fVar1))))))) {
    gjInverse(__return_storage_ptr__,this,singExc);
  }
  else {
    fVar1 = this->x[1][1];
    fVar13 = this->x[1][2];
    fVar14 = this->x[0][2];
    fVar2 = this->x[0][0];
    fVar3 = this->x[0][1];
    fVar4 = this->x[2][0];
    fVar5 = this->x[1][0];
    uVar6 = *(undefined8 *)(this->x[2] + 1);
    fVar16 = (float)uVar6;
    fVar17 = (float)((ulong)uVar6 >> 0x20);
    fVar15 = fVar1 * fVar17 - fVar13 * fVar16;
    local_38 = fVar4 * fVar13 - fVar17 * fVar5;
    local_48 = CONCAT44(fVar14 * fVar16 - fVar17 * fVar3,fVar15);
    local_40 = fVar3 * fVar13 - fVar14 * fVar1;
    uStack_3c = 0;
    fStack_34 = fVar17 * fVar2 - fVar14 * fVar4;
    fStack_30 = fVar14 * fVar5 - fVar13 * fVar2;
    local_2c = 0.0;
    local_28 = fVar5 * fVar16 - fVar1 * fVar4;
    fStack_24 = fVar4 * fVar3 - fVar16 * fVar2;
    local_20 = fVar2 * fVar1 - fVar3 * fVar5;
    local_1c = 0.0;
    uStack_18 = 0;
    uStack_14 = 0;
    uStack_10 = 0;
    local_c = 1.0;
    fVar13 = local_28 * fVar14 + fVar15 * fVar2 + local_38 * fVar3;
    fVar1 = fVar13;
    if (fVar13 <= -fVar13) {
      fVar1 = -fVar13;
    }
    if (1.0 <= fVar1) {
      lVar11 = 0;
      do {
        lVar9 = 0;
        do {
          *(float *)((long)puVar7 + lVar9 * 4) = *(float *)((long)puVar7 + lVar9 * 4) / fVar13;
          lVar9 = lVar9 + 1;
        } while (lVar9 != 3);
        lVar11 = lVar11 + 1;
        puVar7 = (undefined8 *)((long)puVar7 + 0x10);
      } while (lVar11 != 3);
    }
    else {
      uVar10 = 0;
      bVar12 = false;
      do {
        lVar11 = 0;
        do {
          fVar14 = *(float *)((long)puVar8 + lVar11 * 4);
          fVar2 = fVar14;
          if (fVar14 <= -fVar14) {
            fVar2 = -fVar14;
          }
          if (fVar1 * 8.507059e+37 <= fVar2) {
            if (singExc) {
              this_00 = (SingMatrixExc *)__cxa_allocate_exception(0x48);
              Imath_2_5::SingMatrixExc::SingMatrixExc(this_00,"Cannot invert singular matrix.");
              __cxa_throw(this_00,&SingMatrixExc::typeinfo,Imath_2_5::SingMatrixExc::~SingMatrixExc)
              ;
            }
            *(float *)((long)(__return_storage_ptr__->x + 0) + 0) = 0.0;
            *(float *)((long)(__return_storage_ptr__->x + 0) + 4) = 0.0;
            *(float *)((long)(__return_storage_ptr__->x + 0) + 8) = 0.0;
            *(float *)((long)(__return_storage_ptr__->x + 0) + 0xc) = 0.0;
            *(float *)((long)(__return_storage_ptr__->x + 1) + 0) = 0.0;
            *(float *)((long)(__return_storage_ptr__->x + 1) + 4) = 0.0;
            *(float *)((long)(__return_storage_ptr__->x + 1) + 8) = 0.0;
            *(float *)((long)(__return_storage_ptr__->x + 1) + 0xc) = 0.0;
            *(float *)((long)(__return_storage_ptr__->x + 2) + 0) = 0.0;
            *(float *)((long)(__return_storage_ptr__->x + 2) + 4) = 0.0;
            *(float *)((long)(__return_storage_ptr__->x + 2) + 8) = 0.0;
            *(float *)((long)(__return_storage_ptr__->x + 2) + 0xc) = 0.0;
            *(float *)((long)(__return_storage_ptr__->x + 3) + 0) = 0.0;
            *(float *)((long)(__return_storage_ptr__->x + 3) + 4) = 0.0;
            *(float *)((long)(__return_storage_ptr__->x + 3) + 8) = 0.0;
            *(float *)((long)(__return_storage_ptr__->x + 3) + 0xc) = 0.0;
            __return_storage_ptr__->x[0][0] = 1.0;
            __return_storage_ptr__->x[1][1] = 1.0;
            __return_storage_ptr__->x[2][2] = 1.0;
            __return_storage_ptr__->x[3][3] = 1.0;
            if (!bVar12) {
              return __return_storage_ptr__;
            }
            goto LAB_0058a28d;
          }
          *(float *)((long)puVar8 + lVar11 * 4) = fVar14 / fVar13;
          lVar11 = lVar11 + 1;
        } while (lVar11 != 3);
        bVar12 = 1 < uVar10;
        uVar10 = uVar10 + 1;
        puVar8 = (undefined8 *)((long)puVar8 + 0x10);
      } while (uVar10 != 3);
    }
LAB_0058a28d:
    fVar14 = (float)((uint)this->x[3][0] ^ (uint)DAT_02ea7750);
    fVar1 = this->x[3][1];
    fVar13 = this->x[3][2];
    *(undefined8 *)__return_storage_ptr__->x[0] = local_48;
    *(ulong *)(__return_storage_ptr__->x[0] + 2) = CONCAT44(uStack_3c,local_40);
    __return_storage_ptr__->x[1][0] = local_38;
    *(ulong *)(__return_storage_ptr__->x[1] + 1) = CONCAT44(fStack_30,fStack_34);
    __return_storage_ptr__->x[1][3] = local_2c;
    __return_storage_ptr__->x[2][0] = local_28;
    *(ulong *)(__return_storage_ptr__->x[2] + 1) = CONCAT44(local_20,fStack_24);
    __return_storage_ptr__->x[2][3] = local_1c;
    __return_storage_ptr__->x[3][0] =
         (fVar14 * (float)local_48 - fVar1 * local_38) - fVar13 * local_28;
    *(ulong *)(__return_storage_ptr__->x[3] + 1) =
         CONCAT44((local_40 * fVar14 - fVar1 * fStack_30) - fVar13 * local_20,
                  (fVar14 * (float)((ulong)local_48 >> 0x20) - fVar1 * fStack_34) -
                  fVar13 * fStack_24);
    __return_storage_ptr__->x[3][3] = local_c;
  }
  return __return_storage_ptr__;
}

Assistant:

Matrix44<T>
Matrix44<T>::inverse (bool singExc) const
{
    if (x[0][3] != 0 || x[1][3] != 0 || x[2][3] != 0 || x[3][3] != 1)
        return gjInverse(singExc);

    Matrix44 s (x[1][1] * x[2][2] - x[2][1] * x[1][2],
                x[2][1] * x[0][2] - x[0][1] * x[2][2],
                x[0][1] * x[1][2] - x[1][1] * x[0][2],
                0,

                x[2][0] * x[1][2] - x[1][0] * x[2][2],
                x[0][0] * x[2][2] - x[2][0] * x[0][2],
                x[1][0] * x[0][2] - x[0][0] * x[1][2],
                0,

                x[1][0] * x[2][1] - x[2][0] * x[1][1],
                x[2][0] * x[0][1] - x[0][0] * x[2][1],
                x[0][0] * x[1][1] - x[1][0] * x[0][1],
                0,

                0,
                0,
                0,
                1);

    T r = x[0][0] * s[0][0] + x[0][1] * s[1][0] + x[0][2] * s[2][0];

    if (IMATH_INTERNAL_NAMESPACE::abs (r) >= 1)
    {
        for (int i = 0; i < 3; ++i)
        {
            for (int j = 0; j < 3; ++j)
            {
                s[i][j] /= r;
            }
        }
    }
    else
    {
        T mr = IMATH_INTERNAL_NAMESPACE::abs (r) / limits<T>::smallest();

        for (int i = 0; i < 3; ++i)
        {
            for (int j = 0; j < 3; ++j)
            {
                if (mr > IMATH_INTERNAL_NAMESPACE::abs (s[i][j]))
                {
                    s[i][j] /= r;
                }
                else
                {
                    if (singExc)
                        throw SingMatrixExc ("Cannot invert singular matrix.");

                    return Matrix44();
                }
            }
        }
    }

    s[3][0] = -x[3][0] * s[0][0] - x[3][1] * s[1][0] - x[3][2] * s[2][0];
    s[3][1] = -x[3][0] * s[0][1] - x[3][1] * s[1][1] - x[3][2] * s[2][1];
    s[3][2] = -x[3][0] * s[0][2] - x[3][1] * s[1][2] - x[3][2] * s[2][2];

    return s;
}